

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

alik_css_seas_object alik_css_seas_init(int p,int d,int q,int s,int P,int D,int Q,int N)

{
  int iVar1;
  alik_css_seas_object paVar2;
  double dVar3;
  int local_30;
  int t;
  int r;
  int i;
  alik_css_seas_object obj;
  int D_local;
  int P_local;
  int s_local;
  int q_local;
  int d_local;
  int p_local;
  
  local_30 = p + s * P;
  iVar1 = q + s * Q + 1;
  if (local_30 < iVar1) {
    local_30 = iVar1;
  }
  paVar2 = (alik_css_seas_object)malloc((long)local_30 * 0x10 + 0x60 + (long)N * 0x18);
  paVar2->p = p;
  paVar2->d = d;
  paVar2->q = q;
  paVar2->s = s;
  paVar2->P = P;
  paVar2->D = D;
  paVar2->Q = Q;
  paVar2->N = N;
  paVar2->length = N;
  paVar2->pq = p + q + P + Q;
  paVar2->M = 0;
  if ((d == 0) && (D == 0)) {
    paVar2->pq = paVar2->pq + 1;
    paVar2->M = 1;
  }
  paVar2->r = p + s * P;
  iVar1 = q + 1 + s * Q;
  if (paVar2->r < iVar1) {
    paVar2->r = iVar1;
  }
  iVar1 = paVar2->r;
  paVar2->offset = paVar2->r << 1;
  for (t = 0; t < iVar1; t = t + 1) {
    paVar2->x[t] = 0.0;
  }
  for (t = 0; t < iVar1; t = t + 1) {
    paVar2->x[t + local_30] = 0.0;
  }
  dVar3 = macheps();
  paVar2->eps = dVar3;
  paVar2->mean = 0.0;
  return paVar2;
}

Assistant:

alik_css_seas_object alik_css_seas_init(int p, int d, int q, int s, int P, int D, int Q, int N) {
	alik_css_seas_object obj = NULL;
	int i, r, t;

	r = p + s*P;

	t = q + s*Q + 1;

	if (r < t) {
		r = t;
	}
	else {
		t = r;
	}

	obj = (alik_css_seas_object)malloc(sizeof(struct alik_css_seas_set) + sizeof(double)* 2 * r + sizeof(double)* 3 * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->N = N;
	obj->length = N;
	obj->pq = p + q + P + Q;

	obj->M = 0;

	if (d == 0 && D == 0) {
		obj->pq = obj->pq + 1;
		obj->M = 1;
	}

	obj->r = p + s * P;

	t = 1 + q + s*Q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	obj->offset = 2 * obj->r;

	for (i = 0; i < t; ++i) {
		obj->x[i] = 0.0;// phi
	}

	for (i = 0; i < t; ++i) {
		obj->x[i + r] = 0.0;//theta
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}